

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O1

char * tnt_sbuf_object_resize(tnt_stream *s,size_t size)

{
  long *plVar1;
  void *pvVar2;
  ulong size_00;
  ulong uVar3;
  
  plVar1 = (long *)s->data;
  uVar3 = size + plVar1[1];
  if ((ulong)plVar1[2] < uVar3) {
    size_00 = plVar1[2] * 2;
    if (size_00 <= uVar3) {
      size_00 = uVar3;
    }
    pvVar2 = tnt_mem_realloc((void *)*plVar1,size_00);
    if (pvVar2 == (void *)0x0) {
      tnt_mem_free((void *)*plVar1);
      return (char *)0x0;
    }
    *plVar1 = (long)pvVar2;
    plVar1[2] = size_00;
  }
  return (char *)(*plVar1 + plVar1[1]);
}

Assistant:

static char *
tnt_sbuf_object_resize(struct tnt_stream *s, size_t size) {
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	if (sb->size + size > sb->alloc) {
		size_t newsize = 2 * (sb->alloc);
		if (newsize < sb->size + size)
			newsize = sb->size + size;
		char *nd = tnt_mem_realloc(sb->data, newsize);
		if (nd == NULL) {
			tnt_mem_free(sb->data);
			return NULL;
		}
		sb->data = nd;
		sb->alloc = newsize;
	}
	return sb->data + sb->size;
}